

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionSquare<double,_1>::setEigenDecomposition
          (EigenDecompositionSquare<double,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  int iVar1;
  size_t __n;
  
  memcpy((this->super_EigenDecomposition<double,_1>).gEigenValues[eigenIndex],inEigenValues,
         (ulong)(uint)this->kEigenValuesSize << 3);
  iVar1 = (this->super_EigenDecomposition<double,_1>).kStateCount;
  __n = (ulong)(uint)(iVar1 * iVar1) << 3;
  memcpy(this->gEMatrices[eigenIndex],inEigenVectors,__n);
  memcpy(this->gIMatrices[eigenIndex],inInverseEigenVectors,__n);
  if (((this->super_EigenDecomposition<double,_1>).kFlags & 0x200000) == 0) {
    return;
  }
  transposeSquareMatrix<double>
            (this->gIMatrices[eigenIndex],(this->super_EigenDecomposition<double,_1>).kStateCount);
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										             const double* inEigenVectors,
                                                     const double* inInverseEigenVectors,
                                                     const double* inEigenValues) {
    
	beagleMemCpy(gEigenValues[eigenIndex],inEigenValues,kEigenValuesSize);
	const int len = kStateCount * kStateCount;
	beagleMemCpy(gEMatrices[eigenIndex],inEigenVectors,len);
	beagleMemCpy(gIMatrices[eigenIndex],inInverseEigenVectors,len);
    if (kFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED) // TODO: optimize, might not need to transpose here
        transposeSquareMatrix(gIMatrices[eigenIndex], kStateCount);
}